

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

ostream * operator<<(ostream *s,Function *f)

{
  ostream *poVar1;
  uint i;
  uint i_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double d;
  Matrix m;
  Matrix local_330;
  Matrix local_230;
  Matrix local_130;
  
  dVar3 = f->dXMin;
  dVar4 = f->dXStep;
  dVar2 = floor((f->dXMax - dVar3) / dVar4 + 0.5);
  i = (uint)dVar2;
  Matrix::Matrix(&local_330,i,2);
  Function::unvalidate(f);
  if (0 < (int)i) {
    dVar3 = floor(dVar3 / dVar4 + 0.5);
    i_00 = 0;
    do {
      dVar4 = (double)(int)((int)dVar3 + i_00) * f->dXStep;
      Function::setXInput(f,dVar4);
      Matrix::operator[](&local_230,&local_330,i_00);
      Matrix::operator[](&local_130,&local_230,0);
      Matrix::operator=(&local_130,dVar4);
      Matrix::~Matrix(&local_130);
      Matrix::~Matrix(&local_230);
      (*(f->super_Physical)._vptr_Physical[0xc])(f);
      Matrix::operator[](&local_230,&local_330,i_00);
      Matrix::operator[](&local_130,&local_230,1);
      Matrix::operator=(&local_130,d);
      Matrix::~Matrix(&local_130);
      Matrix::~Matrix(&local_230);
      if ((i_00 & 7) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\rdisplaying function: ",0x16);
        poVar1 = std::ostream::_M_insert<double>(((double)(int)i_00 / (double)(int)i) * 100.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%         \t",0xb);
        std::ostream::flush();
      }
      i_00 = i_00 + 1;
    } while (i != i_00);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\rdisplaying function: done.         \t",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  poVar1 = operator<<(s,&local_330);
  Matrix::~Matrix(&local_330);
  return poVar1;
}

Assistant:

ostream& operator<<(ostream& s, Function& f)
{
	// only x input
	int n = int(floor((f.dXMax - f.dXMin)/f.dXStep + 0.5));
	int c = int(floor(f.dXMin/f.dXStep + 0.5));
	Matrix m( n, 2 );
	double d = f.dXMin;
        f.unvalidate();
 	for (int i=0; i<n; ++i, ++c) {
		d = c * f.dXStep;
		f.setXInput(d);
		m[i][0] = d;
		m[i][1] = f.getValue();
		if (!(i&0x7)) cout << "\rdisplaying function: " << double(i) / double(n) * 100.0 << "%         \t" << flush;
	}
	cout << "\rdisplaying function: done.         \t" << endl;
	
	// x and y input
	
	return s << m;
}